

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O0

void exponentialTest(void)

{
  double dVar1;
  System *pSVar2;
  System *pSVar3;
  long *plVar4;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  System *local_58;
  System *s2;
  allocator local_39;
  string local_38 [32];
  System *local_18;
  System *s1;
  Model *m;
  
  pSVar2 = (System *)Model::createModel();
  s1 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"sys1",&local_39);
  pSVar3 = (System *)(**(code **)(*(long *)pSVar2 + 0x50))(0,pSVar2,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pSVar2 = s1;
  local_18 = pSVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"sys2",&local_79);
  pSVar3 = (System *)(**(code **)(*(long *)pSVar2 + 0x50))(0,pSVar2,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pSVar2 = s1;
  local_58 = pSVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"exp",&local_a1);
  Model::createFlow<FlowExp>((Model *)pSVar2,(string *)local_a0,local_18,local_58);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  (*(code *)**(undefined8 **)s1)(s1,0,100);
  pSVar2 = s1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"sys1",&local_c9);
  plVar4 = (long *)(**(code **)(*(long *)pSVar2 + 0x40))(pSVar2,local_c8);
  dVar1 = (double)(**(code **)(*plVar4 + 8))();
  if (0.0001 <= ABS(dVar1 - 36.6032)) {
    __assert_fail("fabs(m->findSystem(\"sys1\")->getValue() - 36.6032) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0xd,"void exponentialTest()");
  }
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pSVar2 = s1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"sys2",&local_f1);
  plVar4 = (long *)(**(code **)(*(long *)pSVar2 + 0x40))(pSVar2,local_f0);
  dVar1 = (double)(**(code **)(*plVar4 + 8))();
  if (ABS(dVar1 - 63.3968) < 0.0001) {
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    return;
  }
  __assert_fail("fabs(m->findSystem(\"sys2\")->getValue() - 63.3968) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0xe,"void exponentialTest()");
}

Assistant:

void exponentialTest() {
    auto *m = Model::createModel();
    auto *s1 = m->createSystem("sys1", 100.0);
    auto *s2 = m->createSystem("sys2", 0.0);
    m->createFlow<FlowExp>("exp", s1, s2);
    m->execute(0, 100);
    assert(fabs(m->findSystem("sys1")->getValue() - 36.6032) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 63.3968) < 0.0001);
}